

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkDfsSeq(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  int iVar2;
  int *__s;
  Vec_Ptr_t *vNodes;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  long lVar6;
  
  if (pNtk->ntkType == ABC_NTK_NETLIST) {
    __assert_fail("!Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                  ,0x1b1,"Vec_Ptr_t *Abc_NtkDfsSeq(Abc_Ntk_t *)");
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar2 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar2 + 500;
    iVar5 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar5) {
      __s = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar5;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar2) {
      memset(__s,0,(uVar1 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar5;
  }
  iVar2 = pNtk->nTravIds;
  pNtk->nTravIds = iVar2 + 1;
  if (iVar2 < 0x3fffffff) {
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    vNodes->nCap = 100;
    vNodes->nSize = 0;
    ppvVar3 = (void **)malloc(800);
    vNodes->pArray = ppvVar3;
    pVVar4 = pNtk->vPos;
    if (0 < pVVar4->nSize) {
      lVar6 = 0;
      do {
        Abc_NtkDfsSeq_rec((Abc_Obj_t *)pVVar4->pArray[lVar6],vNodes);
        lVar6 = lVar6 + 1;
        pVVar4 = pNtk->vPos;
      } while (lVar6 < pVVar4->nSize);
    }
    pVVar4 = pNtk->vPis;
    if (0 < pVVar4->nSize) {
      lVar6 = 0;
      do {
        Abc_NtkDfsSeq_rec((Abc_Obj_t *)pVVar4->pArray[lVar6],vNodes);
        lVar6 = lVar6 + 1;
        pVVar4 = pNtk->vPis;
      } while (lVar6 < pVVar4->nSize);
    }
    return vNodes;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsSeq( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj;
    int i;
    assert( !Abc_NtkIsNetlist(pNtk) );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachPo( pNtk, pObj, i )
        Abc_NtkDfsSeq_rec( pObj, vNodes );
    // mark the PIs
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDfsSeq_rec( pObj, vNodes );
    return vNodes;
}